

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jointObservations)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  Index IVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 auVar11 [64];
  undefined1 extraout_var_00 [56];
  
  uVar4 = (ulong)t;
  puVar1 = (this->_m_firstJOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->_m_firstJOHIforT).
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    IVar5 = Globals::CastLIndexToIndex(puVar1[uVar4]);
    puVar2 = (jointObservations->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (**(code **)((long)*this->_m_madp + 200))();
    auVar11._8_56_ = extraout_var;
    auVar11._0_8_ = extraout_XMM0_Qa;
    if (t != 0) {
      uVar10 = (ulong)IVar5;
      auVar3 = vcvtusi2sd_avx512f(auVar11._0_16_,uVar6);
      iVar8 = t - 1;
      lVar9 = 0;
      do {
        auVar12._0_8_ = pow(auVar3._0_8_,(double)iVar8);
        auVar12._8_56_ = extraout_var_00;
        lVar7 = vcvttsd2usi_avx512f(auVar12._0_16_);
        uVar10 = uVar10 + (ulong)*(uint *)((long)puVar2 + lVar9) * lVar7;
        IVar5 = (Index)uVar10;
        lVar9 = lVar9 + 4;
        iVar8 = iVar8 + -1;
      } while (uVar4 << 2 != lVar9);
    }
    return IVar5;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        Index t, const vector<Index>& jointObservations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJOHIforT.at(t)), 
                &jointObservations[0],
                GetNrJointObservations()
                )
          );    
/*
    size_t this_JOHI=_m_firstJOHIforT.at(t);
    size_t nrJO = GetNrJointObservations();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJO, (double)(exponent));
        this_JOHI += jointObservations.at(ts) * b;
    }
    return(this_JOHI);*/
}